

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

object * chest_check(player *p,loc_conflict grid,chest_query check_type)

{
  _Bool _Var1;
  object *local_30;
  object *obj;
  chest_query check_type_local;
  player *p_local;
  loc_conflict grid_local;
  
  local_30 = square_object((chunk *)cave,grid);
  do {
    if (local_30 == (object *)0x0) {
      return (object *)0x0;
    }
    _Var1 = ignore_item_ok(p,local_30);
    if (!_Var1) {
      if (check_type == CHEST_ANY) {
        _Var1 = tval_is_chest(local_30);
        if (_Var1) {
          return local_30;
        }
      }
      else if (check_type == CHEST_OPENABLE) {
        _Var1 = tval_is_chest(local_30);
        if ((_Var1) && (local_30->pval != 0)) {
          return local_30;
        }
      }
      else if ((((check_type == CHEST_TRAPPED) && (_Var1 = is_trapped_chest(local_30), _Var1)) &&
               (local_30->known != (object *)0x0)) && (local_30->known->pval != 0)) {
        return local_30;
      }
    }
    local_30 = local_30->next;
  } while( true );
}

Assistant:

struct object *chest_check(const struct player *p, struct loc grid,
		enum chest_query check_type)
{
	struct object *obj;

	/* Scan all objects in the grid */
	for (obj = square_object(cave, grid); obj; obj = obj->next) {
		/* Ignore if requested */
		if (ignore_item_ok(p, obj)) continue;

		/* Check for chests */
		switch (check_type) {
		case CHEST_ANY:
			if (tval_is_chest(obj))
				return obj;
			break;
		case CHEST_OPENABLE:
			if (tval_is_chest(obj) && (obj->pval != 0))
				return obj;
			break;
		case CHEST_TRAPPED:
			if (is_trapped_chest(obj) && obj->known && obj->known->pval)
				return obj;
			break;
		}
	}

	/* No chest */
	return NULL;
}